

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintTupleTo<std::tuple<int,double,int,int,int>,4ul>
               (tuple<int,_double,_int,_int,_int> *t,ostream *param_2)

{
  __tuple_element_t<3UL,_tuple<int,_double,_int,_int,_int>_> *value;
  ostream *os_local;
  tuple<int,_double,_int,_int,_int> *t_local;
  
  PrintTupleTo<std::tuple<int,double,int,int,int>,3ul>(t,param_2);
  std::operator<<(param_2,", ");
  value = std::get<3ul,int,double,int,int,int>(t);
  UniversalPrinter<int>::Print(value,param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}